

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

string * __thiscall
cfd::core::Address::GetAddress_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  Address *this_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->address_);
  return __return_storage_ptr__;
}

Assistant:

std::string Address::GetAddress() const { return address_; }